

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbTest.c
# Opt level: O2

Gia_Man_t * Acb_NtkGiaDeriveDual(Acb_Ntk_t *p)

{
  int iVar1;
  Vec_Int_t *p_00;
  Gia_Man_t *p_01;
  char *pcVar2;
  int *piVar3;
  Vec_Int_t *p_02;
  Vec_Int_t *p_03;
  Gia_Man_t *pGVar4;
  int iVar5;
  
  p_00 = Vec_IntStartFull((p->vObjType).nSize * 2 + -2);
  p_01 = Gia_ManStart((p->vObjType).nSize * 5 + -5);
  pcVar2 = Acb_NtkStr(p,p->NameId);
  pcVar2 = Abc_UtilStrsav(pcVar2);
  p_01->pName = pcVar2;
  Gia_ManHashAlloc(p_01);
  piVar3 = Vec_IntEntryP(p_00,0);
  piVar3[0] = 0;
  piVar3[1] = 0;
  for (iVar5 = 0; iVar5 < (p->vCis).nSize; iVar5 = iVar5 + 1) {
    iVar1 = Vec_IntEntry(&p->vCis,iVar5);
    piVar3 = Vec_IntEntryP(p_00,iVar1 * 2);
    iVar1 = Gia_ManAppendCi(p_01);
    *piVar3 = iVar1;
    piVar3[1] = 0;
  }
  p_02 = Vec_IntAlloc(4);
  p_03 = Acb_NtkFindNodes2(p);
  for (iVar5 = 0; iVar5 < p_03->nSize; iVar5 = iVar5 + 1) {
    iVar1 = Vec_IntEntry(p_03,iVar5);
    piVar3 = Vec_IntEntryP(p_00,iVar1 * 2);
    Acb_ObjToGiaDual(p_01,p,iVar1,p_02,p_00,piVar3);
  }
  Vec_IntFree(p_03);
  Vec_IntFree(p_02);
  for (iVar5 = 0; iVar5 < (p->vCos).nSize; iVar5 = iVar5 + 1) {
    iVar1 = Vec_IntEntry(&p->vCos,iVar5);
    piVar3 = Acb_ObjFanins(p,iVar1);
    piVar3 = Vec_IntEntryP(p_00,piVar3[1] * 2);
    Gia_ManAppendCo(p_01,*piVar3);
    Gia_ManAppendCo(p_01,piVar3[1]);
  }
  Vec_IntFree(p_00);
  pGVar4 = Gia_ManCleanup(p_01);
  Gia_ManStop(p_01);
  return pGVar4;
}

Assistant:

Gia_Man_t * Acb_NtkGiaDeriveDual( Acb_Ntk_t * p )
{
    extern Vec_Int_t * Acb_NtkFindNodes2( Acb_Ntk_t * p );
    Gia_Man_t * pNew, * pOne;
    Vec_Int_t * vFanins, * vNodes;
    Vec_Int_t * vCopies = Vec_IntStartFull( 2*Acb_NtkObjNum(p) );
    int i, iObj, * pLits;
    pNew = Gia_ManStart( 5 * Acb_NtkObjNum(p) );
    pNew->pName = Abc_UtilStrsav(Acb_NtkName(p));
    Gia_ManHashAlloc( pNew );
    pLits = Vec_IntEntryP( vCopies, 0 );
    pLits[0] = 0;
    pLits[1] = 0;
    Acb_NtkForEachCi( p, iObj, i )
    {
        pLits = Vec_IntEntryP( vCopies, 2*iObj );
        pLits[0] = Gia_ManAppendCi(pNew);
        pLits[1] = 0;
    }
    vFanins = Vec_IntAlloc( 4 );
    vNodes  = Acb_NtkFindNodes2( p );
    Vec_IntForEachEntry( vNodes, iObj, i )
    {
        pLits = Vec_IntEntryP( vCopies, 2*iObj );
        Acb_ObjToGiaDual( pNew, p, iObj, vFanins, vCopies, pLits );
    }
    Vec_IntFree( vNodes );
    Vec_IntFree( vFanins );
    Acb_NtkForEachCo( p, iObj, i )
    {
        pLits = Vec_IntEntryP( vCopies, 2*Acb_ObjFanin(p, iObj, 0) );
        Gia_ManAppendCo( pNew, pLits[0] );
        Gia_ManAppendCo( pNew, pLits[1] );
    }
    Vec_IntFree( vCopies );
    pNew = Gia_ManCleanup( pOne = pNew );
    Gia_ManStop( pOne );
    return pNew;
}